

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

ElementDocument * __thiscall Rml::Context::LoadDocument(Context *this,Stream *stream)

{
  NodePtr pDVar1;
  ulong uVar2;
  ulong *puVar3;
  URL *this_00;
  String *document_path;
  ElementDocument *document;
  ulong uVar5;
  pointer *__ptr;
  uint8_t *puVar6;
  ulong *puVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>_>
  *data_model;
  iterator iVar8;
  _Head_base<0UL,_Rml::Element_*,_false> local_48;
  Element *local_40;
  Dictionary local_38;
  NodePtr pDVar4;
  
  this_00 = Stream::GetSourceURL(stream);
  document_path = URL::GetURL_abi_cxx11_(this_00);
  PluginRegistry::NotifyDocumentOpen(this,document_path);
  Factory::InstanceDocumentStream((Factory *)&local_40,this,stream,&this->documents_base_tag);
  if (local_40 == (Element *)0x0) {
    document = (ElementDocument *)0x0;
  }
  else {
    document = rmlui_static_cast<Rml::ElementDocument*,Rml::Element*>(local_40);
    local_48._M_head_impl = local_40;
    local_40 = (Element *)0x0;
    Element::AppendChild
              ((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
               _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(ElementPtr *)&local_48,
               true);
    if (local_48._M_head_impl != (Element *)0x0) {
      (*((local_48._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
    }
    local_48._M_head_impl = (Element *)0x0;
    PluginRegistry::NotifyDocumentLoad(document);
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Element::DispatchEvent(&document->super_Element,Load,&local_38);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_38.m_container);
    iVar8 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->data_models);
    pDVar4 = iVar8.mKeyVals;
    pDVar1 = (NodePtr)(this->data_models).mInfo;
    while (pDVar4 != pDVar1) {
      puVar6 = iVar8.mInfo;
      DataModel::Update(((iVar8.mKeyVals)->mData).second._M_t.
                        super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>
                        .super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl,false);
      pDVar4 = iVar8.mKeyVals + 1;
      uVar5 = *(ulong *)(puVar6 + 1);
      if (uVar5 == 0) {
        puVar3 = (ulong *)(puVar6 + 9);
        do {
          puVar7 = puVar3;
          pDVar4 = pDVar4 + 8;
          uVar5 = *puVar7;
          puVar3 = puVar7 + 1;
        } while (uVar5 == 0);
      }
      else {
        puVar7 = (ulong *)(puVar6 + 1);
      }
      uVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar5 = uVar2 >> 3 & 0x1fffffff;
      pDVar4 = pDVar4 + uVar5;
      iVar8.mInfo = (uint8_t *)((long)puVar7 + uVar5);
      iVar8.mKeyVals = pDVar4;
    }
    ElementDocument::UpdateDocument(document);
    if (local_40 != (Element *)0x0) {
      (**(code **)(*(long *)local_40 + 0x10))();
    }
  }
  return document;
}

Assistant:

ElementDocument* Context::LoadDocument(Stream* stream)
{
	PluginRegistry::NotifyDocumentOpen(this, stream->GetSourceURL().GetURL());

	ElementPtr element = Factory::InstanceDocumentStream(this, stream, GetDocumentsBaseTag());
	if (!element)
		return nullptr;

	ElementDocument* document = rmlui_static_cast<ElementDocument*>(element.get());

	root->AppendChild(std::move(element));

	// The 'load' event is fired before updating the document, because the user might
	// need to initalize things before running an update. The drawback is that computed
	// values and layouting are not performed yet, resulting in default values when
	// querying such information in the event handler.
	PluginRegistry::NotifyDocumentLoad(document);
	document->DispatchEvent(EventId::Load, Dictionary());

	// Data models are updated after the 'load' event so that the user has a chance to change
	// any data variables first. We do not clear dirty variables here, since users may need to
	// retrieve whether or not eg. a data variable has changed in a controller.
	for (auto& data_model : data_models)
		data_model.second->Update(false);

	document->UpdateDocument();

	return document;
}